

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_phmap::flat_hash_set<unsigned_long,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
        *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->size_ != 0) {
    uVar2 = this->capacity_;
    if (uVar2 < 0x80) {
      if (uVar2 != 0) {
        lVar3 = 8;
        uVar1 = 0;
        do {
          if (-1 < this->ctrl_[uVar1]) {
            raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
            ::destroy_slots((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)((long)this->slots_ + lVar3));
            uVar2 = this->capacity_;
          }
          uVar1 = uVar1 + 1;
          lVar3 = lVar3 + 0x38;
        } while (uVar1 != uVar2);
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar2 + 0x10);
        this->ctrl_[uVar2] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, phmap::flat_hash_set<unsigned long>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, phmap::flat_hash_set<unsigned long>>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, phmap::flat_hash_set<unsigned long>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, phmap::flat_hash_set<unsigned long>>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}